

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVInt.cpp
# Opt level: O3

void slang::SVInt::divide
               (SVInt *lhs,uint32_t lhsWords,SVInt *rhs,uint32_t rhsWords,SVInt *quotient,
               SVInt *remainder)

{
  undefined4 *puVar1;
  uint32_t *__s;
  uint32_t *value;
  uint uVar2;
  SVInt *pSVar3;
  undefined8 uVar4;
  byte bVar5;
  bool bVar6;
  uint32_t i;
  int iVar7;
  uint uVar8;
  undefined1 *__s_00;
  ulong uVar9;
  uint32_t *value_00;
  SVInt *pSVar10;
  ulong uVar11;
  ulong uVar12;
  byte bVar13;
  ulong uVar14;
  ulong uVar15;
  uint32_t uVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint *puVar23;
  ulong uVar24;
  ulong uVar25;
  uint uVar26;
  uint uVar27;
  ulong uVar28;
  int iVar29;
  TempBuffer<unsigned_int,_128UL> scratch;
  undefined1 local_230 [512];
  
  uVar20 = rhsWords * 2;
  uVar8 = lhsWords * 2;
  uVar26 = uVar8 + rhsWords * -2;
  iVar7 = (4 - (uint)(remainder == (SVInt *)0x0)) * uVar20;
  uVar21 = (ulong)(iVar7 + uVar26 * 2 + 1);
  if (iVar7 + uVar26 * 2 < 0x80) {
    __s_00 = local_230;
  }
  else {
    __s_00 = (undefined1 *)operator_new__(uVar21 << 2);
  }
  uVar14 = (ulong)uVar8;
  puVar1 = (undefined4 *)(__s_00 + uVar14 * 4);
  puVar23 = (uint *)(__s_00 + uVar14 * 4 + 4);
  uVar24 = (ulong)uVar20;
  value = puVar1 + uVar24 + 1;
  __s = value + uVar14;
  value_00 = __s;
  if (remainder == (SVInt *)0x0) {
    value_00 = (uint32_t *)0x0;
  }
  memset(__s_00,0,uVar14 * 4 + 4);
  if (lhsWords != 0) {
    pSVar3 = (SVInt *)(lhs->super_SVIntStorage).field_0.val;
    pSVar10 = lhs;
    if (((lhs->super_SVIntStorage).unknownFlag & 1U) != 0) {
      pSVar10 = pSVar3;
    }
    if (0x40 < (lhs->super_SVIntStorage).bitWidth) {
      pSVar10 = pSVar3;
    }
    uVar15 = 0;
    do {
      uVar4 = *(undefined8 *)((long)&(pSVar10->super_SVIntStorage).field_0 + uVar15 * 4);
      *(int *)(__s_00 + (uVar15 & 0xffffffff) * 4) = (int)uVar4;
      *(int *)(__s_00 + (ulong)((int)uVar15 + 1) * 4) = (int)((ulong)uVar4 >> 0x20);
      uVar15 = uVar15 + 2;
    } while ((ulong)lhsWords * 2 != uVar15);
  }
  memset(puVar23,0,uVar24 * 4);
  if (rhsWords != 0) {
    pSVar3 = (SVInt *)(rhs->super_SVIntStorage).field_0.val;
    pSVar10 = rhs;
    if (((rhs->super_SVIntStorage).unknownFlag & 1U) != 0) {
      pSVar10 = pSVar3;
    }
    if (0x40 < (rhs->super_SVIntStorage).bitWidth) {
      pSVar10 = pSVar3;
    }
    uVar15 = 0;
    do {
      uVar4 = *(undefined8 *)((long)&(pSVar10->super_SVIntStorage).field_0 + uVar15 * 4);
      puVar23[uVar15 & 0xffffffff] = (uint)uVar4;
      puVar23[(int)uVar15 + 1] = (uint)((ulong)uVar4 >> 0x20);
      uVar15 = uVar15 + 2;
    } while ((ulong)rhsWords * 2 != uVar15);
  }
  uVar15 = 0;
  memset(value,0,uVar14 * 4);
  if (remainder != (SVInt *)0x0) {
    memset(__s,0,uVar24 * 4);
  }
  *puVar1 = 0;
  uVar17 = uVar24;
  if (uVar20 != 0) {
    do {
      if (puVar1[uVar17] != 0) {
        uVar15 = uVar17 & 0xffffffff;
        uVar26 = uVar8 - (int)uVar17;
        break;
      }
      uVar17 = uVar17 - 1;
      uVar26 = uVar8;
    } while (uVar17 != 0);
  }
  uVar17 = (ulong)uVar26;
  if (uVar8 != 0) {
    uVar11 = uVar14;
    do {
      if (*(int *)(__s_00 + uVar11 * 4 + -4) != 0) goto LAB_00277918;
      uVar11 = uVar11 - 1;
      uVar17 = (ulong)((int)uVar17 - 1);
    } while (uVar11 != 0);
    uVar17 = (ulong)(uVar26 + lhsWords * -2);
  }
LAB_00277918:
  iVar29 = (int)uVar15;
  iVar7 = (int)uVar17;
  if (iVar29 == 1) {
    if (iVar7 < 0) {
      uVar16 = 0;
    }
    else {
      uVar8 = *puVar23;
      uVar15 = (ulong)uVar8;
      iVar7 = iVar7 + 1;
      puVar23 = (uint *)(__s_00 + uVar17 * 4);
      uVar17 = 0;
      do {
        uVar11 = uVar17 << 0x20;
        uVar26 = *puVar23;
        uVar17 = (ulong)uVar26;
        uVar11 = uVar11 | uVar17;
        if (uVar11 == 0) {
          puVar23[uVar14 + uVar24 + 1] = 0;
LAB_00277991:
          uVar17 = 0;
        }
        else if (uVar11 < uVar15) {
          puVar23[uVar14 + uVar24 + 1] = 0;
        }
        else {
          if (uVar11 == uVar15) {
            puVar23[uVar14 + uVar24 + 1] = 1;
            goto LAB_00277991;
          }
          uVar20 = (uint)(uVar11 / uVar15);
          puVar23[uVar14 + uVar24 + 1] = uVar20;
          uVar17 = (ulong)(uVar26 - uVar20 * uVar8);
        }
        uVar16 = (uint32_t)uVar17;
        iVar7 = iVar7 + -1;
        puVar23 = puVar23 + -1;
      } while (0 < iVar7);
    }
    if (remainder != (SVInt *)0x0) {
      *__s = uVar16;
    }
  }
  else {
    uVar26 = iVar29 - 1;
    uVar14 = (ulong)uVar26;
    uVar8 = puVar23[uVar14];
    if (uVar8 == 0) {
      uVar20 = 0x20;
    }
    else {
      uVar20 = 0x1f;
      if (uVar8 != 0) {
        for (; uVar8 >> uVar20 == 0; uVar20 = uVar20 - 1) {
        }
      }
      uVar20 = uVar20 ^ 0x1f;
    }
    uVar8 = iVar29 + iVar7;
    bVar5 = (byte)uVar20;
    if (uVar20 == 0) {
      uVar22 = 0;
    }
    else {
      if (uVar8 == 0) {
        uVar22 = 0;
      }
      else {
        uVar24 = 0;
        uVar27 = 0;
        do {
          uVar22 = *(uint *)(__s_00 + uVar24 * 4) >> (0x20 - bVar5 & 0x1f);
          *(uint *)(__s_00 + uVar24 * 4) = *(uint *)(__s_00 + uVar24 * 4) << (bVar5 & 0x1f) | uVar27
          ;
          uVar24 = uVar24 + 1;
          uVar27 = uVar22;
        } while (uVar8 != uVar24);
      }
      if (iVar29 != 0) {
        uVar24 = 0;
        uVar27 = 0;
        do {
          uVar2 = puVar23[uVar24];
          puVar23[uVar24] = uVar2 << (bVar5 & 0x1f) | uVar27;
          uVar24 = uVar24 + 1;
          uVar27 = uVar2 >> (0x20 - bVar5 & 0x1f);
        } while (uVar15 != uVar24);
      }
    }
    *(uint *)(__s_00 + (ulong)uVar8 * 4) = uVar22;
    do {
      iVar7 = (int)uVar17;
      uVar8 = iVar29 + iVar7;
      uVar25 = (ulong)uVar8;
      uVar28 = (ulong)puVar23[uVar14];
      uVar24 = CONCAT44(*(undefined4 *)(__s_00 + uVar25 * 4),
                        *(undefined4 *)(__s_00 + (ulong)((iVar29 + iVar7) - 1) * 4)) / uVar28;
      uVar11 = CONCAT44(*(undefined4 *)(__s_00 + uVar25 * 4),
                        *(undefined4 *)(__s_00 + (ulong)((iVar29 + iVar7) - 1) * 4)) % uVar28;
      if ((uVar24 == 0x100000000) ||
         (uVar12 = (ulong)*(uint *)(__s_00 + (ulong)(uVar8 - 2) * 4) | uVar11 << 0x20,
         uVar9 = uVar24,
         uVar12 <= puVar23[iVar29 - 2U] * uVar24 && puVar23[iVar29 - 2U] * uVar24 - uVar12 != 0)) {
        uVar9 = uVar24 - 1;
        uVar11 = uVar11 + uVar28;
        if ((uVar11 >> 0x20 == 0) &&
           ((uVar9 == 0x100000000 ||
            (uVar11 = (ulong)*(uint *)(__s_00 + (ulong)(uVar8 - 2) * 4) | uVar11 << 0x20,
            uVar11 <= puVar23[iVar29 - 2U] * uVar9 && puVar23[iVar29 - 2U] * uVar9 - uVar11 != 0))))
        {
          uVar9 = uVar24 - 2;
        }
      }
      uVar16 = (uint32_t)uVar9;
      if (iVar29 == 0) {
        value[uVar17] = uVar16;
      }
      else {
        uVar24 = 0;
        lVar18 = 0;
        do {
          uVar8 = puVar23[uVar24];
          uVar11 = (ulong)(uint)(iVar7 + (int)uVar24);
          lVar18 = (ulong)*(uint *)(__s_00 + uVar11 * 4) - ((uVar8 * uVar9 & 0xffffffff) + lVar18);
          *(int *)(__s_00 + uVar11 * 4) = (int)lVar18;
          lVar18 = (uVar8 * uVar9 >> 0x20) - (lVar18 >> 0x20);
          uVar24 = uVar24 + 1;
        } while (uVar15 != uVar24);
        uVar8 = *(uint *)(__s_00 + uVar25 * 4);
        *(uint *)(__s_00 + uVar25 * 4) = uVar8 - (int)lVar18;
        value[uVar17] = uVar16;
        if ((long)(ulong)uVar8 < lVar18) {
          value[uVar17] = uVar16 - 1;
          uVar24 = 0;
          uVar8 = 0;
          do {
            uVar11 = (ulong)(uint)(iVar7 + (int)uVar24);
            uVar22 = puVar23[uVar24];
            uVar27 = *(uint *)(__s_00 + uVar11 * 4);
            uVar2 = uVar27;
            if (uVar22 < uVar27) {
              uVar2 = uVar22;
            }
            bVar13 = (byte)uVar8;
            uVar27 = uVar8 + uVar22 + uVar27;
            *(uint *)(__s_00 + uVar11 * 4) = uVar27;
            uVar8 = 1;
            if (uVar2 <= uVar27) {
              uVar8 = (uint)(bVar13 & uVar27 == uVar2);
            }
            uVar24 = uVar24 + 1;
          } while (uVar15 != uVar24);
          *(uint *)(__s_00 + uVar25 * 4) = *(int *)(__s_00 + uVar25 * 4) + uVar8;
        }
      }
      bVar6 = uVar17 != 0;
      uVar17 = uVar17 - 1;
    } while (bVar6);
    if (remainder != (SVInt *)0x0) {
      if (uVar20 == 0) {
        if (-1 < (int)uVar26) {
          lVar18 = uVar14 + 1;
          do {
            value_00[lVar18 + -1] = *(uint32_t *)(__s_00 + lVar18 * 4 + -4);
            lVar19 = lVar18 + -1;
            bVar6 = 0 < lVar18;
            lVar18 = lVar19;
          } while (lVar19 != 0 && bVar6);
        }
      }
      else if (-1 < (int)uVar26) {
        lVar18 = uVar14 + 1;
        uVar8 = 0;
        do {
          uVar26 = *(uint *)(__s_00 + lVar18 * 4 + -4);
          value_00[lVar18 + -1] = uVar26 >> (bVar5 & 0x1f) | uVar8;
          lVar19 = lVar18 + -1;
          bVar6 = 0 < lVar18;
          lVar18 = lVar19;
          uVar8 = uVar26 << (0x20 - bVar5 & 0x1f);
        } while (lVar19 != 0 && bVar6);
      }
    }
  }
  bVar6 = (bool)((rhs->super_SVIntStorage).signFlag & (lhs->super_SVIntStorage).signFlag);
  buildDivideResult(quotient,value,(lhs->super_SVIntStorage).bitWidth,bVar6,lhsWords);
  buildDivideResult(remainder,value_00,(rhs->super_SVIntStorage).bitWidth,bVar6,rhsWords);
  if ((0x80 < uVar21) && (__s_00 != (undefined1 *)0x0)) {
    operator_delete__(__s_00);
  }
  return;
}

Assistant:

void SVInt::divide(const SVInt& lhs, uint32_t lhsWords, const SVInt& rhs, uint32_t rhsWords,
                   SVInt* quotient, SVInt* remainder) {
    SLANG_ASSERT(lhsWords >= rhsWords);

    // The Knuth algorithm requires arrays of 32-bit words (because results of operations
    // need to fit natively into 64 bits). Allocate space for the backing memory, either on
    // the stack if it's small or on the heap if it's not.
    uint32_t divisorWords = rhsWords * 2;
    uint32_t extraWords = (lhsWords * 2) - divisorWords;
    uint32_t dividendWords = divisorWords + extraWords;

    size_t totalWordsNeeded = (remainder ? 4 : 3) * divisorWords + 2 * extraWords + 1;
    TempBuffer<uint32_t, 128> scratch(totalWordsNeeded);
    uint32_t* u = scratch.get();
    uint32_t* v = u + dividendWords + 1;
    uint32_t* q = v + divisorWords;
    uint32_t* r = remainder ? q + dividendWords : nullptr;

    // Initialize the dividend and divisor
    memset(u, 0, (dividendWords + 1) * sizeof(uint32_t));
    splitWords(lhs, u, lhsWords);

    memset(v, 0, divisorWords * sizeof(uint32_t));
    splitWords(rhs, v, rhsWords);

    // Initialize quotient and remainder
    memset(q, 0, dividendWords * sizeof(uint32_t));
    if (remainder)
        memset(r, 0, divisorWords * sizeof(uint32_t));

    // extra word for spill space in Knuth algorithm
    u[dividendWords] = 0;

    // Adjust sizes for division. The Knuth algorithm will fail if there
    // are empty words in the input.
    for (uint32_t i = divisorWords; i > 0 && v[i - 1] == 0; i--) {
        divisorWords--;
        extraWords++;
    }
    for (uint32_t i = dividendWords; i > 0 && u[i - 1] == 0; i--)
        extraWords--;

    // If we're left with only a single divisor word, Knuth won't work.
    // We can use a sequence of standard 64 bit divides for this.
    dividendWords = divisorWords + extraWords;
    if (divisorWords == 1) {
        uint32_t divisor = v[0];
        uint32_t rem = 0;
        for (int i = int(dividendWords - 1); i >= 0; i--) {
            uint64_t partial_dividend = uint64_t(rem) << 32 | u[i];
            if (partial_dividend == 0) {
                q[i] = 0;
                rem = 0;
            }
            else if (partial_dividend < divisor) {
                q[i] = 0;
                rem = (uint32_t)partial_dividend;
            }
            else if (partial_dividend == divisor) {
                q[i] = 1;
                rem = 0;
            }
            else {
                q[i] = (uint32_t)(partial_dividend / divisor);
                rem = (uint32_t)(partial_dividend - (q[i] * divisor));
            }
        }
        if (r)
            r[0] = rem;
    }
    else {
        // otherwise invoke Knuth
        knuthDiv(u, v, q, r, extraWords, divisorWords);
    }

    bool bothSigned = lhs.signFlag && rhs.signFlag;
    buildDivideResult(quotient, q, lhs.bitWidth, bothSigned, lhsWords);
    buildDivideResult(remainder, r, rhs.bitWidth, bothSigned, rhsWords);
}